

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool do_zzz_fp(DisasContext_conflict1 *s,arg_rrr_esz *a,undefined1 *fn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t oprsz;
  uint32_t dofs;
  uint32_t aofs;
  uint32_t bofs;
  TCGv_ptr ptr;
  TCGv_ptr status;
  uint vsz;
  TCGContext_conflict1 *tcg_ctx;
  undefined1 *fn_local;
  arg_rrr_esz *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (fn == (undefined1 *)0x0) {
    s_local._7_1_ = false;
  }
  else {
    _Var1 = sve_access_check_aarch64(s);
    if (_Var1) {
      oprsz = vec_full_reg_size(s);
      ptr = get_fpstatus_ptr_aarch64(tcg_ctx_00,a->esz == 1);
      dofs = vec_full_reg_offset(s,a->rd);
      aofs = vec_full_reg_offset(s,a->rn);
      bofs = vec_full_reg_offset(s,a->rm);
      tcg_gen_gvec_3_ptr_aarch64(tcg_ctx_00,dofs,aofs,bofs,ptr,oprsz,oprsz,0,fn);
      tcg_temp_free_ptr(tcg_ctx_00,ptr);
    }
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool do_zzz_fp(DisasContext *s, arg_rrr_esz *a,
                      gen_helper_gvec_3_ptr *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (fn == NULL) {
        return false;
    }
    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        TCGv_ptr status = get_fpstatus_ptr(tcg_ctx, a->esz == MO_16);
        tcg_gen_gvec_3_ptr(tcg_ctx, vec_full_reg_offset(s, a->rd),
                           vec_full_reg_offset(s, a->rn),
                           vec_full_reg_offset(s, a->rm),
                           status, vsz, vsz, 0, fn);
        tcg_temp_free_ptr(tcg_ctx, status);
    }
    return true;
}